

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

BrandArgumentList * __thiscall
capnp::Schema::getBrandArgumentsAtScope
          (BrandArgumentList *__return_storage_ptr__,Schema *this,uint64_t scopeId)

{
  RawBrandedSchema *pRVar1;
  RawSchema *pRVar2;
  ulong uVar3;
  Scope *pSVar4;
  uint uVar5;
  long lVar6;
  Binding *pBVar7;
  bool bVar8;
  bool bVar9;
  DebugExpression<bool> _kjCondition;
  Fault f;
  ArrayPtr<const_char> local_78;
  WirePointer *local_68;
  int local_60;
  StructReader local_50;
  
  local_68 = (WirePointer *)this->raw->generic->encodedNode;
  local_78 = (ArrayPtr<const_char>)ZEXT816(0);
  local_60 = 0x7fffffff;
  _::PointerReader::getStruct(&local_50,(PointerReader *)&local_78,(word *)0x0);
  if (local_50.dataSize < 0x121) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = (bool)(*(byte *)((long)local_50.data + 0x24) & 1);
    if (_kjCondition.value != false) {
      pRVar1 = this->raw;
      uVar3 = (ulong)pRVar1->scopeCount;
      bVar8 = uVar3 == 0;
      if (!bVar8) {
        pSVar4 = pRVar1->scopes;
        if (pSVar4->typeId != scopeId) {
          lVar6 = uVar3 * 0x18;
          do {
            lVar6 = lVar6 + -0x18;
            bVar8 = lVar6 == 0;
            if (bVar8) goto LAB_001372ab;
            pSVar4 = pSVar4 + 1;
          } while (pSVar4->typeId != scopeId);
        }
        bVar9 = pSVar4->isUnbound == false;
        if (bVar9) {
          uVar5 = pSVar4->bindingCount;
          pBVar7 = pSVar4->bindings;
        }
        else {
          uVar5 = 0;
          pBVar7 = (Binding *)0x0;
        }
        __return_storage_ptr__->scopeId = scopeId;
        __return_storage_ptr__->size_ = uVar5;
        __return_storage_ptr__->isUnbound = !bVar9;
        __return_storage_ptr__->bindings = pBVar7;
        if (!bVar8) {
          return __return_storage_ptr__;
        }
      }
LAB_001372ab:
      pRVar2 = pRVar1->generic;
      __return_storage_ptr__->scopeId = scopeId;
      __return_storage_ptr__->size_ = 0;
      __return_storage_ptr__->isUnbound = &pRVar2->defaultBrand != pRVar1 && uVar3 == 0;
      __return_storage_ptr__->bindings = (Binding *)0x0;
      return __return_storage_ptr__;
    }
  }
  local_68 = (WirePointer *)this->raw->generic->encodedNode;
  local_78 = (ArrayPtr<const_char>)ZEXT816(0);
  local_60 = 0x7fffffff;
  _::PointerReader::getStruct(&local_50,(PointerReader *)&local_78,(word *)0x0);
  local_78 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&local_50);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[20],capnp::Text::Reader>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0xfb,FAILED,"getProto().getIsGeneric()",
             "_kjCondition,\"Not a generic type.\", getProto().getDisplayName()",&_kjCondition,
             (char (*) [20])"Not a generic type.",(Reader *)&local_78);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Schema::BrandArgumentList Schema::getBrandArgumentsAtScope(uint64_t scopeId) const {
  KJ_REQUIRE(getProto().getIsGeneric(), "Not a generic type.", getProto().getDisplayName());

  for (auto scope: kj::range(raw->scopes, raw->scopes + raw->scopeCount)) {
    if (scope->typeId == scopeId) {
      // OK, this scope matches the scope we're looking for.
      if (scope->isUnbound) {
        return BrandArgumentList(scopeId, true);
      } else {
        return BrandArgumentList(scopeId, scope->bindingCount, scope->bindings);
      }
    }
  }

  // This scope is not listed in the scopes list.
  return BrandArgumentList(scopeId, raw->isUnbound());
}